

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_str_finish(sqlite3_str *p)

{
  char *local_18;
  char *z;
  sqlite3_str *p_local;
  
  if ((p == (sqlite3_str *)0x0) || (p == &sqlite3OomStr)) {
    local_18 = (char *)0x0;
  }
  else {
    local_18 = sqlite3StrAccumFinish(p);
    sqlite3_free(p);
  }
  return local_18;
}

Assistant:

SQLITE_API char *sqlite3_str_finish(sqlite3_str *p){
  char *z;
  if( p!=0 && p!=&sqlite3OomStr ){
    z = sqlite3StrAccumFinish(p);
    sqlite3_free(p);
  }else{
    z = 0;
  }
  return z;
}